

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addMayerTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::Cost> *cost)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  string *__x;
  double end;
  TimeRange newTimerange;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_80;
  double local_70;
  double local_68;
  string local_60;
  TimeRange local_40;
  
  local_70 = weight;
  local_68 = TimeRange::endTime(&this->m_pimpl->horizon);
  end = TimeRange::endTime(&this->m_pimpl->horizon);
  TimeRange::TimeRange(&local_40,local_68,end);
  pOVar1 = this->m_pimpl;
  local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (cost->super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (cost->super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"addMayerTerm","");
  bVar2 = OptimalControlProblemPimpl::addCost
                    (pOVar1,local_70,&local_40,&local_80,false,false,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80.super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar2) {
    pOVar1 = this->m_pimpl;
    __x = Cost::name_abi_cxx11_
                    ((cost->
                     super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pOVar1->mayerCostnames,__x);
  }
  return bVar2;
}

Assistant:

bool OptimalControlProblem::addMayerTerm(double weight, std::shared_ptr<Cost> cost)
        {
            TimeRange newTimerange(m_pimpl->horizon.endTime(), m_pimpl->horizon.endTime());
            if (!(m_pimpl->addCost(weight, newTimerange, cost, false, false, "addMayerTerm"))) {
                return false;
            }
            m_pimpl->mayerCostnames.push_back(cost->name());

            return true;
        }